

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffobjs.c
# Opt level: O3

void cff_size_done(FT_Size cffsize)

{
  undefined8 *P;
  FT_Face pFVar1;
  FT_Memory memory;
  FT_Driver pFVar2;
  FT_Driver_Class pFVar3;
  code *pcVar4;
  FT_Module pFVar5;
  long lVar6;
  ulong uVar7;
  PSHinter_Service pshinter;
  
  P = (undefined8 *)cffsize->internal->module_data;
  if (P == (undefined8 *)0x0) {
    return;
  }
  pFVar1 = cffsize->face;
  memory = pFVar1->memory;
  pFVar2 = pFVar1[4].driver;
  pFVar3 = pFVar2[0x58].clazz;
  pFVar5 = FT_Get_Module((pFVar1->driver->root).library,"pshinter");
  if ((((pFVar5 != (FT_Module)0x0) && (pFVar3 != (FT_Driver_Class)0x0)) &&
      (pcVar4 = (code *)(pFVar3->root).module_flags, pcVar4 != (code *)0x0)) &&
     (lVar6 = (*pcVar4)(pFVar5), lVar6 != 0)) {
    (**(code **)(lVar6 + 0x10))(*P);
    for (uVar7 = (ulong)*(uint *)&pFVar2[0x33].root.library; uVar7 != 0; uVar7 = uVar7 - 1) {
      (**(code **)(lVar6 + 0x10))(P[uVar7]);
    }
  }
  ft_mem_free(memory,P);
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  cff_size_done( FT_Size  cffsize )        /* CFF_Size */
  {
    FT_Memory     memory   = cffsize->face->memory;
    CFF_Size      size     = (CFF_Size)cffsize;
    CFF_Face      face     = (CFF_Face)size->root.face;
    CFF_Font      font     = (CFF_Font)face->extra.data;
    CFF_Internal  internal = (CFF_Internal)cffsize->internal->module_data;


    if ( internal )
    {
      PSH_Globals_Funcs  funcs;


      funcs = cff_size_get_globals_funcs( size );
      if ( funcs )
      {
        FT_UInt  i;


        funcs->destroy( internal->topfont );

        for ( i = font->num_subfonts; i > 0; i-- )
          funcs->destroy( internal->subfonts[i - 1] );
      }

      FT_FREE( internal );
    }
  }